

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

int ON_String::FormatVargsIntoBuffer(ON_StringBuffer *buffer,char *format,__va_list_tag *args)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_t buffer_capacity;
  va_list args_copy;
  __va_list_tag local_38;
  
  local_38.reg_save_area = args->reg_save_area;
  local_38.gp_offset = args->gp_offset;
  local_38.fp_offset = args->fp_offset;
  local_38.overflow_arg_area = args->overflow_arg_area;
  uVar2 = FormatVargsOutputCount(format,&local_38);
  buffer_capacity = 1;
  if (0 < (int)uVar2) {
    buffer_capacity = (ulong)uVar2 + 1;
  }
  bVar1 = ON_StringBuffer::GrowBuffer(buffer,buffer_capacity);
  if (((bVar1) && (buffer->m_buffer != (char *)0x0)) && (buffer->m_buffer_capacity != 0)) {
    *buffer->m_buffer = '\0';
    buffer->m_buffer[buffer->m_buffer_capacity - 1] = '\0';
    uVar3 = uVar2;
    if (0 < (int)uVar2) {
      uVar3 = FormatVargsIntoBuffer(buffer->m_buffer,buffer->m_buffer_capacity,format,args);
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((int)uVar2 < -1) {
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

int ON_String::FormatVargsIntoBuffer(
  ON_StringBuffer& buffer,
  const char* format,
  va_list args
  )
{
  va_list args_copy;
  va_copy(args_copy, args);
  int rc = ON_String::FormatVargsOutputCount(format, args_copy);
  va_end(args_copy);

  size_t buffer_capacity = (rc <= 0) ? 1 : (size_t(rc) + 1);
  if (false == buffer.GrowBuffer(buffer_capacity) || nullptr == buffer.m_buffer || buffer.m_buffer_capacity <= 0)
    return (rc < 0 ? rc : -1);

  buffer.m_buffer[0] = 0;
  buffer.m_buffer[buffer.m_buffer_capacity - 1] = 0;
  if (rc > 0)
  {
    rc = ON_String::FormatVargsIntoBuffer(buffer.m_buffer, buffer.m_buffer_capacity, format, args);
  }
  return rc;
}